

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O0

void comex_create_group_and_igroup(comex_group_t *id,comex_igroup_t **igroup)

{
  group_link *pgVar1;
  undefined8 *in_RSI;
  comex_group_t *in_RDI;
  comex_igroup_t *last_group_list_item;
  comex_igroup_t *new_group_list_item;
  comex_igroup_t *local_20;
  
  for (local_20 = group_list; local_20->next != (group_link *)0x0; local_20 = local_20->next) {
  }
  pgVar1 = (group_link *)malloc(0x20);
  pgVar1->id = local_20->id + 1;
  pgVar1->comm = (MPI_Comm)&ompi_mpi_comm_null;
  pgVar1->group = (MPI_Group)&ompi_mpi_group_null;
  pgVar1->next = (group_link *)0x0;
  local_20->next = pgVar1;
  *in_RSI = pgVar1;
  *in_RDI = pgVar1->id;
  return;
}

Assistant:

static void comex_create_group_and_igroup(
        comex_group_t *id, comex_igroup_t **igroup)
{
    comex_igroup_t *new_group_list_item = NULL;
    comex_igroup_t *last_group_list_item = NULL;

    /* find the last group in the group linked list */
    last_group_list_item = group_list;
    while (last_group_list_item->next != NULL) {
        last_group_list_item = last_group_list_item->next;
    }

    /* create, init, and insert the new node for the linked list */
    new_group_list_item = malloc(sizeof(comex_igroup_t));
    new_group_list_item->id = last_group_list_item->id + 1;
    new_group_list_item->comm = MPI_COMM_NULL;
    new_group_list_item->group = MPI_GROUP_NULL;
    new_group_list_item->next = NULL;
    last_group_list_item->next = new_group_list_item;

    /* return the group id and comex igroup */
    *igroup = new_group_list_item;
    *id = new_group_list_item->id;
}